

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix44<float> * __thiscall
Imath_2_5::Matrix44<float>::operator-(Matrix44<float> *this,Matrix44<float> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Matrix44<float> *in_RDI;
  
  fVar1 = this->x[0][1];
  fVar2 = this->x[0][2];
  fVar3 = this->x[0][3];
  fVar4 = v->x[0][1];
  fVar5 = v->x[0][2];
  fVar6 = v->x[0][3];
  in_RDI->x[0][0] = this->x[0][0] - v->x[0][0];
  in_RDI->x[0][1] = fVar1 - fVar4;
  in_RDI->x[0][2] = fVar2 - fVar5;
  in_RDI->x[0][3] = fVar3 - fVar6;
  fVar1 = this->x[1][1];
  fVar2 = this->x[1][2];
  fVar3 = this->x[1][3];
  fVar4 = v->x[1][1];
  fVar5 = v->x[1][2];
  fVar6 = v->x[1][3];
  in_RDI->x[1][0] = this->x[1][0] - v->x[1][0];
  in_RDI->x[1][1] = fVar1 - fVar4;
  in_RDI->x[1][2] = fVar2 - fVar5;
  in_RDI->x[1][3] = fVar3 - fVar6;
  fVar1 = this->x[2][1];
  fVar2 = this->x[2][2];
  fVar3 = this->x[2][3];
  fVar4 = v->x[2][1];
  fVar5 = v->x[2][2];
  fVar6 = v->x[2][3];
  in_RDI->x[2][0] = this->x[2][0] - v->x[2][0];
  in_RDI->x[2][1] = fVar1 - fVar4;
  in_RDI->x[2][2] = fVar2 - fVar5;
  in_RDI->x[2][3] = fVar3 - fVar6;
  fVar1 = this->x[3][1];
  fVar2 = this->x[3][2];
  fVar3 = this->x[3][3];
  fVar4 = v->x[3][1];
  fVar5 = v->x[3][2];
  fVar6 = v->x[3][3];
  in_RDI->x[3][0] = this->x[3][0] - v->x[3][0];
  in_RDI->x[3][1] = fVar1 - fVar4;
  in_RDI->x[3][2] = fVar2 - fVar5;
  in_RDI->x[3][3] = fVar3 - fVar6;
  return in_RDI;
}

Assistant:

Matrix44<T>
Matrix44<T>::operator - (const Matrix44<T> &v) const
{
    return Matrix44 (x[0][0] - v.x[0][0],
                     x[0][1] - v.x[0][1],
                     x[0][2] - v.x[0][2],
                     x[0][3] - v.x[0][3],
                     x[1][0] - v.x[1][0],
                     x[1][1] - v.x[1][1],
                     x[1][2] - v.x[1][2],
                     x[1][3] - v.x[1][3],
                     x[2][0] - v.x[2][0],
                     x[2][1] - v.x[2][1],
                     x[2][2] - v.x[2][2],
                     x[2][3] - v.x[2][3],
                     x[3][0] - v.x[3][0],
                     x[3][1] - v.x[3][1],
                     x[3][2] - v.x[3][2],
                     x[3][3] - v.x[3][3]);
}